

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall
asmjit::StringBuilder::_opHex(StringBuilder *this,uint32_t op,void *data,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  Error EVar3;
  
  EVar3 = 1;
  if (len < 0x7fffffffffffffff) {
    pcVar1 = prepare(this,op,len * 2);
    if (pcVar1 != (char *)0x0) {
      EVar3 = 0;
      for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
        pcVar1[sVar2 * 2] =
             "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*(byte *)((long)data + sVar2) >> 4];
        pcVar1[sVar2 * 2 + 1] =
             "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*(byte *)((long)data + sVar2) & 0xf];
      }
    }
  }
  return EVar3;
}

Assistant:

Error StringBuilder::_opHex(uint32_t op, const void* data, size_t len) noexcept {
  char* dst;

  if (len >= IntTraits<size_t>::maxValue() / 2 || !(dst = prepare(op, len * 2)))
    return DebugUtils::errored(kErrorNoHeapMemory);;

  const char* src = static_cast<const char*>(data);
  for (size_t i = 0; i < len; i++, dst += 2, src++) {
    dst[0] = StringBuilder_numbers[(src[0] >> 4) & 0xF];
    dst[1] = StringBuilder_numbers[(src[0]     ) & 0xF];
  }
  return kErrorOk;
}